

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_stringi(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLint numExtensions;
  GLuint local_34;
  string local_30;
  
  local_34 = 0;
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if name is not an accepted value.",""
            );
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetStringi(&ctx->super_CallLogWrapper,0xffffffff,0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if index is outside the valid range for indexed state name."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x821d,(GLint *)&local_34);
  glu::CallLogWrapper::glGetStringi(&ctx->super_CallLogWrapper,0x1f03,local_34);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_stringi (NegativeTestContext& ctx)
{
	GLint numExtensions	= 0;

	ctx.beginSection("GL_INVALID_ENUM is generated if name is not an accepted value.");
	ctx.glGetStringi(-1, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside the valid range for indexed state name.");
	ctx.glGetIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
	ctx.glGetStringi(GL_EXTENSIONS, numExtensions);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}